

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# anim.cpp
# Opt level: O3

void __thiscall rw::AnimInterpolator::addTime(AnimInterpolator *this,float32 t)

{
  int iVar1;
  Animation *anim;
  bool bVar2;
  long *plVar3;
  long lVar4;
  int iVar5;
  long *plVar6;
  AnimInterpolator *pAVar7;
  long *plVar8;
  long lVar9;
  int iVar10;
  float fVar11;
  
  if (0.0 < (float)t) {
    fVar11 = (float)t + (float)this->currentTime;
    this->currentTime = (float32)fVar11;
    anim = this->currentAnim;
    if ((float)anim->duration <= fVar11 && fVar11 != (float)anim->duration) {
      setCurrentAnim(this,anim);
      return;
    }
    iVar10 = this->currentAnimKeyFrameSize;
    plVar3 = (long *)((long)anim->numFrames * (long)iVar10 + (long)anim->keyframes);
    plVar6 = (long *)this->nextFrame;
    if (plVar6 < plVar3) {
      iVar5 = this->numNodes;
      iVar1 = this->currentInterpKeyFrameSize;
      plVar8 = (long *)0x0;
      do {
        if (fVar11 < *(float *)(*plVar6 + 8)) break;
        if (iVar5 < 1) {
          lVar4 = plVar8[1];
        }
        else {
          pAVar7 = this + 1;
          lVar9 = 1;
          do {
            lVar4 = *(long *)&pAVar7->currentTime;
            pAVar7 = (AnimInterpolator *)((long)&pAVar7->currentAnim + (long)iVar1);
            if (lVar4 == *plVar6) break;
            bVar2 = lVar9 < iVar5;
            lVar9 = lVar9 + 1;
          } while (bVar2);
          plVar8 = (long *)((long)pAVar7 - (long)iVar1);
        }
        *plVar8 = lVar4;
        plVar8[1] = (long)plVar6;
        plVar6 = (long *)((long)plVar6 + (long)iVar10);
        this->nextFrame = plVar6;
      } while (plVar6 < plVar3);
    }
    else {
      iVar5 = this->numNodes;
    }
    if (0 < iVar5) {
      iVar10 = 0;
      do {
        lVar4 = (long)this->currentInterpKeyFrameSize * (long)iVar10;
        (*this->interpCB)((Animation **)((long)&this[1].currentAnim + lVar4),
                          *(Animation **)((long)&this[1].currentAnim + lVar4),
                          *(void **)((long)&this[1].currentTime + lVar4),this->currentTime,
                          this->currentAnim->customData);
        iVar10 = iVar10 + 1;
      } while (iVar10 < this->numNodes);
    }
  }
  return;
}

Assistant:

void
AnimInterpolator::addTime(float32 t)
{
	int32 i;
	if(t <= 0.0f)
		return;
	this->currentTime += t;
	// reset animation
	if(this->currentTime > this->currentAnim->duration){
		this->setCurrentAnim(this->currentAnim);
		return;
	}
	KeyFrameHeader *last = this->getAnimFrame(this->currentAnim->numFrames);
	KeyFrameHeader *next = (KeyFrameHeader*)this->nextFrame;
	InterpFrameHeader *ifrm = nil;
	while(next < last && next->prev->time <= this->currentTime){
		// find next interpolation frame to expire
		for(i = 0; i < this->numNodes; i++){
			ifrm = this->getInterpFrame(i);
			if(ifrm->keyFrame2 == next->prev)
				break;
		}
		// advance interpolation frame
		ifrm->keyFrame1 = ifrm->keyFrame2;
		ifrm->keyFrame2 = next;
		// ... and next frame
		next = (KeyFrameHeader*)((uint8*)this->nextFrame +
		                         currentAnimKeyFrameSize);
		this->nextFrame = next;
	}
	for(i = 0; i < this->numNodes; i++){
		ifrm = this->getInterpFrame(i);
		this->interpCB(ifrm, ifrm->keyFrame1, ifrm->keyFrame2,
		               this->currentTime,
		               this->currentAnim->customData);
	}
}